

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

UBool fallback(char *loc)

{
  char *localeID;
  int iVar1;
  size_t sVar2;
  UErrorCode local_1c;
  char *pcStack_18;
  UErrorCode status;
  char *loc_local;
  
  if (*loc == '\0') {
    loc_local._7_1_ = '\0';
  }
  else {
    local_1c = U_ZERO_ERROR;
    pcStack_18 = loc;
    iVar1 = strcmp(loc,"en_GB");
    localeID = pcStack_18;
    if (iVar1 == 0) {
      strcpy(pcStack_18 + 3,"001");
    }
    else {
      sVar2 = strlen(pcStack_18);
      uloc_getParent_63(localeID,localeID,(int32_t)sVar2,&local_1c);
    }
    loc_local._7_1_ = '\x01';
  }
  return loc_local._7_1_;
}

Assistant:

static UBool fallback(char *loc) {
    if (!*loc) {
        return FALSE;
    }
    UErrorCode status = U_ZERO_ERROR;
    if (uprv_strcmp(loc, "en_GB") == 0) {
        // HACK: See #13368.  We need "en_GB" to fall back to "en_001" instead of "en"
        // in order to consume the correct data strings.  This hack will be removed
        // when proper data sink loading is implemented here.
        // NOTE: "001" adds 1 char over "GB".  However, both call sites allocate
        // arrays with length ULOC_FULLNAME_CAPACITY (plenty of room for en_001).
        uprv_strcpy(loc + 3, "001");
    } else {
        uloc_getParent(loc, loc, (int32_t)uprv_strlen(loc), &status);
    }
 /*
    char *i = uprv_strrchr(loc, '_');
    if (i == NULL) {
        i = loc;
    }
    *i = 0;
 */
    return TRUE;
}